

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  JSAMPARRAY in_RDX;
  long in_RSI;
  long in_RDI;
  JLONG outvalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JDIMENSION output_cols;
  JDIMENSION outcol_h;
  JDIMENSION outcol;
  int v;
  int h;
  int numpix2;
  int numpix;
  int v_expand;
  int h_expand;
  int outrow;
  int inrow;
  long local_68;
  undefined1 *local_60;
  byte *local_58;
  uint local_48;
  uint local_44;
  int local_40;
  int local_3c;
  int local_28;
  int local_24;
  
  uVar1 = *(int *)(in_RSI + 0x1c) * 8;
  iVar2 = *(int *)(in_RDI + 0x138) / *(int *)(in_RSI + 8);
  iVar3 = *(int *)(in_RDI + 0x13c) / *(int *)(in_RSI + 0xc);
  expand_right_edge(in_RDX,*(int *)(in_RDI + 0x13c),*(JDIMENSION *)(in_RDI + 0x30),uVar1 * iVar2);
  local_24 = 0;
  for (local_28 = 0; local_28 < *(int *)(in_RSI + 0xc); local_28 = local_28 + 1) {
    local_48 = 0;
    local_60 = *(undefined1 **)(in_RCX + (long)local_28 * 8);
    for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
      local_68 = 0;
      for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
        local_58 = in_RDX[local_24 + local_40] + local_48;
        for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
          local_68 = (ulong)*local_58 + local_68;
          local_58 = local_58 + 1;
        }
      }
      *local_60 = (char)((local_68 + (iVar2 * iVar3) / 2) / (long)(iVar2 * iVar3));
      local_48 = iVar2 + local_48;
      local_60 = local_60 + 1;
    }
    local_24 = iVar3 + local_24;
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
               JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;  /* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  JSAMPROW inptr, outptr;
  JLONG outvalue;

  h_expand = cinfo->max_h_samp_factor / compptr->h_samp_factor;
  v_expand = cinfo->max_v_samp_factor / compptr->v_samp_factor;
  numpix = h_expand * v_expand;
  numpix2 = numpix / 2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * h_expand);

  inrow = 0;
  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
         outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
        inptr = input_data[inrow + v] + outcol_h;
        for (h = 0; h < h_expand; h++) {
          outvalue += (JLONG)(*inptr++);
        }
      }
      *outptr++ = (JSAMPLE)((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
  }
}